

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::FixedSizeInitScan(duckdb *this,ColumnSegment *segment)

{
  BufferManager *pBVar1;
  pointer pFVar2;
  _Head_base<0UL,_duckdb::FixedSizeScanState_*,_false> local_30;
  BufferHandle local_28;
  
  make_uniq<duckdb::FixedSizeScanState>();
  pBVar1 = BufferManager::GetBufferManager(segment->db);
  (*pBVar1->_vptr_BufferManager[7])(&local_28,pBVar1,&segment->block);
  pFVar2 = unique_ptr<duckdb::FixedSizeScanState,_std::default_delete<duckdb::FixedSizeScanState>,_true>
           ::operator->((unique_ptr<duckdb::FixedSizeScanState,_std::default_delete<duckdb::FixedSizeScanState>,_true>
                         *)&local_30);
  BufferHandle::operator=(&pFVar2->handle,&local_28);
  BufferHandle::~BufferHandle(&local_28);
  *(FixedSizeScanState **)this = local_30._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> FixedSizeInitScan(ColumnSegment &segment) {
	auto result = make_uniq<FixedSizeScanState>();
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	result->handle = buffer_manager.Pin(segment.block);
	return std::move(result);
}